

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerator.cpp
# Opt level: O2

string * __thiscall
CodeGenerator::generate_go_code_abi_cxx11_(string *__return_storage_ptr__,CodeGenerator *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,
                 "// Generated by program-homework-solvern\n\npackage main\n\nimport(\"fmt\")\n\nfunc f(x int64) int64 {\n\tanswer := "
                 ,&this->func);
  std::operator+(__return_storage_ptr__,&local_30,
                 "\n\treturn answer;\n}\n\nfunc main(){\n\n\tvar i int64;\n\tfor i=0; i<20; i++ {\n\t\tfmt.Println(f(i))\n\t}\n\n}"
                );
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string CodeGenerator::generate_go_code() {
    string code =
            "// Generated by program-homework-solvern\n\n"
            "package main"
            "\n\n"
            "import(\"fmt\")\n"
            "\nfunc f(x int64) int64 {\n"
            "\tanswer := " + CodeGenerator::func +"\n"
            "\treturn answer;\n"
            "}\n\n"
            "func main(){\n"
            "\n\tvar i int64;"
            "\n\tfor i=0; i<20; i++ {\n"
            "\t\tfmt.Println(f(i))\n"
            "\t}\n"
            "\n}";

    return code;
}